

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3aTextureFilteringTests.cpp
# Opt level: O2

void deqp::gles3::Accuracy::renderFaces
               (Functions *gl,SurfaceAccess *dstRef,TextureCube *refTexture,ReferenceParams *params,
               TextureRenderer *renderer,int x,int y,int width,int height,Vec2 *bottomLeft,
               Vec2 *topRight,Vec2 *texCoordTopRightFactor)

{
  CubeFace CVar1;
  int iVar2;
  GLenum err;
  ulong uVar3;
  ulong uVar4;
  int height_00;
  int width_00;
  CubeFace face;
  int y_00;
  int x_00;
  vector<float,_std::allocator<float>_> texCoord;
  TextureCubeView local_88;
  SurfaceAccess local_50;
  
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = height / 2;
  for (face = CUBEFACE_NEGATIVE_X; face != CUBEFACE_LAST; face = face + CUBEFACE_POSITIVE_X) {
    CVar1 = face - CUBEFACE_POSITIVE_Y;
    if (face < CUBEFACE_POSITIVE_Y) {
      CVar1 = face;
    }
    y_00 = 0;
    if (face >= CUBEFACE_POSITIVE_Y) {
      y_00 = iVar2;
    }
    x_00 = CVar1 * (width / 3);
    if ((face == CUBEFACE_POSITIVE_Z) || (width_00 = width / 3, face == CUBEFACE_NEGATIVE_Y)) {
      width_00 = width - x_00;
    }
    height_00 = iVar2;
    if (CUBEFACE_NEGATIVE_Y < face) {
      height_00 = height - iVar2;
    }
    glu::TextureTestUtil::computeQuadTexCoordCube(&texCoord,face,bottomLeft,topRight);
    uVar3 = (ulong)(face < CUBEFACE_NEGATIVE_Y);
    uVar4 = (ulong)((face & CUBEFACE_LAST) == CUBEFACE_NEGATIVE_Y);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3 * 2 + 6] =
         texCoordTopRightFactor->m_data[0] *
         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar3 * 2 + 6];
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar3 * 2 + 9] =
         texCoordTopRightFactor->m_data[0] *
         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar3 * 2 + 9];
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4 + 4] =
         texCoordTopRightFactor->m_data[1] *
         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar4 + 4];
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4 + 10] =
         texCoordTopRightFactor->m_data[1] *
         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_start[uVar4 + 10];
    (*gl->viewport)(x_00 + x,y_00 + y,width_00,height_00);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&params->super_RenderParams);
    tcu::SurfaceAccess::SurfaceAccess(&local_50,dstRef,x_00,y_00,width_00,height_00);
    local_88.m_levels[5] = (refTexture->m_view).m_levels[5];
    local_88.m_numLevels = (refTexture->m_view).m_numLevels;
    local_88._4_4_ = *(undefined4 *)&(refTexture->m_view).field_0x4;
    local_88.m_levels[0] = (refTexture->m_view).m_levels[0];
    local_88.m_levels[1] = (refTexture->m_view).m_levels[1];
    local_88.m_levels[2] = (refTexture->m_view).m_levels[2];
    local_88.m_levels[3] = (refTexture->m_view).m_levels[3];
    local_88.m_levels[4] = (refTexture->m_view).m_levels[4];
    glu::TextureTestUtil::sampleTexture
              (&local_50,&local_88,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,params);
  }
  err = (*gl->getError)();
  glu::checkError(err,"Post render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/accuracy/es3aTextureFilteringTests.cpp"
                  ,0x20b);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&texCoord.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

static void renderFaces (
	const glw::Functions&		gl,
	const tcu::SurfaceAccess&	dstRef,
	const tcu::TextureCube&		refTexture,
	const ReferenceParams&		params,
	TextureRenderer&			renderer,
	int							x,
	int							y,
	int							width,
	int							height,
	const tcu::Vec2&			bottomLeft,
	const tcu::Vec2&			topRight,
	const tcu::Vec2&			texCoordTopRightFactor)
{
	DE_ASSERT(width == dstRef.getWidth() && height == dstRef.getHeight());

	vector<float> texCoord;

	DE_STATIC_ASSERT(tcu::CUBEFACE_LAST == 6);
	for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
	{
		bool	isRightmost		= (face == 2) || (face == 5);
		bool	isTop			= face >= 3;
		int		curX			= (face % 3) * (width  / 3);
		int		curY			= (face / 3) * (height / 2);
		int		curW			= isRightmost	? (width-curX)	: (width	/ 3);
		int		curH			= isTop			? (height-curY)	: (height	/ 2);

		computeQuadTexCoordCube(texCoord, (tcu::CubeFace)face, bottomLeft, topRight);

		{
			// Move the top and right edges of the texture coord quad. This is useful when we want a cube edge visible.
			int texCoordSRow = face == tcu::CUBEFACE_NEGATIVE_X || face == tcu::CUBEFACE_POSITIVE_X ? 2 : 0;
			int texCoordTRow = face == tcu::CUBEFACE_NEGATIVE_Y || face == tcu::CUBEFACE_POSITIVE_Y ? 2 : 1;
			texCoord[6 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[9 + texCoordSRow] *= texCoordTopRightFactor.x();
			texCoord[3 + texCoordTRow] *= texCoordTopRightFactor.y();
			texCoord[9 + texCoordTRow] *= texCoordTopRightFactor.y();
		}

		gl.viewport(x+curX, y+curY, curW, curH);

		renderer.renderQuad(0, &texCoord[0], params);

		sampleTexture(tcu::SurfaceAccess(dstRef, curX, curY, curW, curH), refTexture, &texCoord[0], params);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Post render");
}